

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SPIRCombinedImageSampler * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::
allocate<unsigned_int&,unsigned_int&,unsigned_int&>
          (ObjectPool<spirv_cross::SPIRCombinedImageSampler> *this,uint *p,uint *p_1,uint *p_2)

{
  Vector<spirv_cross::SPIRCombinedImageSampler_*> *this_00;
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  _Tuple_impl<0UL,_spirv_cross::SPIRCombinedImageSampler_*,_spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>
  _Var4;
  _Head_base<0UL,_spirv_cross::SPIRCombinedImageSampler_*,_false> _Var5;
  size_t sVar6;
  SPIRCombinedImageSampler *pSVar7;
  ulong uVar8;
  
  this_00 = &this->vacants;
  sVar6 = (this->vacants).super_VectorView<spirv_cross::SPIRCombinedImageSampler_*>.buffer_size;
  if (sVar6 == 0) {
    sVar6 = (this->memory).
            super_VectorView<std::unique_ptr<spirv_cross::SPIRCombinedImageSampler,_spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>_>
            .buffer_size;
    uVar8 = (ulong)(this->start_object_count << ((byte)sVar6 & 0x1f));
    _Var4.super__Head_base<0UL,_spirv_cross::SPIRCombinedImageSampler_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRCombinedImageSampler_*,_false>)malloc(uVar8 * 0x18);
    if (_Var4.super__Head_base<0UL,_spirv_cross::SPIRCombinedImageSampler_*,_false>._M_head_impl ==
        (SPIRCombinedImageSampler *)0x0) {
      return (SPIRCombinedImageSampler *)0x0;
    }
    if (uVar8 != 0) {
      sVar6 = 0;
      _Var5._M_head_impl =
           (SPIRCombinedImageSampler *)
           _Var4.super__Head_base<0UL,_spirv_cross::SPIRCombinedImageSampler_*,_false>._M_head_impl;
      do {
        SmallVector<spirv_cross::SPIRCombinedImageSampler_*,_0UL>::reserve(this_00,sVar6 + 1);
        sVar6 = (this->vacants).super_VectorView<spirv_cross::SPIRCombinedImageSampler_*>.
                buffer_size;
        (this->vacants).super_VectorView<spirv_cross::SPIRCombinedImageSampler_*>.ptr[sVar6] =
             _Var5._M_head_impl;
        sVar6 = sVar6 + 1;
        (this->vacants).super_VectorView<spirv_cross::SPIRCombinedImageSampler_*>.buffer_size =
             sVar6;
        _Var5._M_head_impl = _Var5._M_head_impl + 1;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
      sVar6 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRCombinedImageSampler,_spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>_>
              .buffer_size;
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRCombinedImageSampler,_spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>,_8UL>
    ::reserve(&this->memory,sVar6 + 1);
    sVar6 = (this->memory).
            super_VectorView<std::unique_ptr<spirv_cross::SPIRCombinedImageSampler,_spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>_>
            .buffer_size;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRCombinedImageSampler,_spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>_>
    .ptr[sVar6]._M_t.
    super___uniq_ptr_impl<spirv_cross::SPIRCombinedImageSampler,_spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_spirv_cross::SPIRCombinedImageSampler_*,_spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>
    .super__Head_base<0UL,_spirv_cross::SPIRCombinedImageSampler_*,_false> =
         _Var4.super__Head_base<0UL,_spirv_cross::SPIRCombinedImageSampler_*,_false>._M_head_impl;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRCombinedImageSampler,_spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>_>
    .buffer_size = sVar6 + 1;
    sVar6 = (this->vacants).super_VectorView<spirv_cross::SPIRCombinedImageSampler_*>.buffer_size;
    pSVar7 = (this->vacants).super_VectorView<spirv_cross::SPIRCombinedImageSampler_*>.ptr
             [sVar6 - 1];
    if (sVar6 == 0) goto LAB_00232542;
  }
  else {
    pSVar7 = (this_00->super_VectorView<spirv_cross::SPIRCombinedImageSampler_*>).ptr[sVar6 - 1];
  }
  SmallVector<spirv_cross::SPIRCombinedImageSampler_*,_0UL>::resize(this_00,sVar6 - 1);
LAB_00232542:
  uVar1 = *p;
  uVar2 = *p_1;
  uVar3 = *p_2;
  (pSVar7->super_IVariant).self.id = 0;
  (pSVar7->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__IVariant_003577b8;
  *(uint *)&(pSVar7->super_IVariant).field_0xc = uVar1;
  (pSVar7->image).id = uVar2;
  (pSVar7->sampler).id = uVar3;
  return pSVar7;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}